

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O1

void yactfr::internal::buildBasicReadInstr<yactfr::internal::ReadFlSIntInstr>
               (StructureMemberType *memberType,DataType *dt,Proc *baseProc)

{
  undefined1 local_39;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<yactfr::internal::Instr> local_28;
  StructureMemberType *local_18;
  
  local_38 = (element_type *)0x0;
  local_18 = memberType;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::ReadFlSIntInstr,std::allocator<yactfr::internal::ReadFlSIntInstr>,yactfr::StructureMemberType_const*const&,yactfr::DataType_const&>
            (&_Stack_30,(ReadFlSIntInstr **)&local_38,
             (allocator<yactfr::internal::ReadFlSIntInstr> *)&local_39,&local_18,dt);
  local_28.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38
  ;
  local_28.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_30._M_pi;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Proc::pushBack(baseProc,&local_28);
  if (local_28.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

void buildBasicReadInstr(const StructureMemberType * const memberType, const DataType& dt,
                         Proc& baseProc)
{
    baseProc.pushBack(std::make_shared<ReadInstrT>(memberType, dt));
}